

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

bool EV_DoElevator(line_t_conflict *line,EElevator elevtype,double speed,double height,int tag)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  DSectorEffect *pDVar4;
  DElevator *this;
  bool bVar5;
  sector_t_conflict *sec;
  vertex_t *spot;
  FSectorTagIterator itr;
  
  if (line == (line_t_conflict *)0x0 && elevtype == elevateCurrent) {
    bVar5 = false;
  }
  else {
    FSectorTagIterator::FSectorTagIterator(&itr,tag,line);
    bVar5 = false;
    while( true ) {
      uVar3 = FSectorTagIterator::Next(&itr);
      if ((int)uVar3 < 0) break;
      sec = sectors + uVar3;
      bVar1 = sector_t::PlaneMoving((sector_t *)sec,0);
      if (!bVar1) {
        pDVar4 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sec->ceilingdata);
        if (pDVar4 == (DSectorEffect *)0x0) {
          this = (DElevator *)DObject::operator_new(0x78);
          DElevator::DElevator(this,sec);
          this->m_Type = elevtype;
          this->m_Speed = speed;
          DElevator::StartFloorSound(this);
          sector_t::CenterFloor((sector_t *)sec);
          sector_t::CenterCeiling((sector_t *)sec);
          bVar5 = true;
          if (elevtype < (elevateLower|elevateDown)) {
            uVar2 = (*(code *)(&DAT_005cedf8 + *(int *)(&DAT_005cedf8 + (ulong)elevtype * 4)))();
            return (bool)uVar2;
          }
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool EV_DoElevator (line_t *line, DElevator::EElevator elevtype,
					double speed, double height, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t*	sec;
	DElevator*	elevator;
	double		floorheight, ceilingheight;
	double		newheight;
	vertex_t*	spot;

	if (!line && (elevtype == DElevator::elevateCurrent))
		return false;

	secnum = -1;
	rtn = false;

	FSectorTagIterator itr(tag, line);

	// act on all sectors with the same tag as the triggering linedef
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];
		// If either floor or ceiling is already activated, skip it
		if (sec->PlaneMoving(sector_t::floor) || sec->ceilingdata) //jff 2/22/98
			continue; // the loop used to break at the end if tag were 0, but would miss that step if "continue" occured [FDARI]

		// create and initialize new elevator thinker
		rtn = true;
		elevator = new DElevator (sec);
		elevator->m_Type = elevtype;
		elevator->m_Speed = speed;
		elevator->StartFloorSound ();

		floorheight = sec->CenterFloor ();
		ceilingheight = sec->CenterCeiling ();

		// set up the fields according to the type of elevator action
		switch (elevtype)
		{
		// elevator down to next floor
		case DElevator::elevateDown:
			elevator->m_Direction = -1;
			newheight = sec->FindNextLowestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator up to next floor
		case DElevator::elevateUp:
			elevator->m_Direction = 1;
			newheight = sec->FindNextHighestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator to floor height of activating switch's front sector
		case DElevator::elevateCurrent:
			newheight = line->frontsector->floorplane.ZatPoint (line->v1);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (line->v1, newheight);
			newheight += sec->ceilingplane.ZatPoint(line->v1) - sec->floorplane.ZatPoint(line->v1);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (line->v1, newheight);

			elevator->m_Direction =
				elevator->m_FloorDestDist > sec->floorplane.fD() ? -1 : 1;
			break;

		// [RH] elevate up by a specific amount
		case DElevator::elevateRaise:
			elevator->m_Direction = 1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight + height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight + height);
			break;

		// [RH] elevate down by a specific amount
		case DElevator::elevateLower:
			elevator->m_Direction = -1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight - height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight - height);
			break;
		}
	}
	return rtn;
}